

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_eth.c
# Opt level: O0

void csp_eth_arp_get_addr(uint8_t *mac_addr,uint16_t csp_addr)

{
  uint16_t in_SI;
  undefined4 *in_RDI;
  arp_list_entry_t *arp;
  arp_list_entry_t *local_18;
  
  local_18 = arp_list;
  while( true ) {
    if (local_18 == (arp_list_entry_t *)0x0) {
      memset(in_RDI,0xff,6);
      return;
    }
    if (local_18->csp_addr == in_SI) break;
    local_18 = local_18->next;
  }
  *in_RDI = *(undefined4 *)local_18->mac_addr;
  *(undefined2 *)(in_RDI + 1) = *(undefined2 *)(local_18->mac_addr + 4);
  return;
}

Assistant:

void csp_eth_arp_get_addr(uint8_t * mac_addr, uint16_t csp_addr)
{
    for (arp_list_entry_t * arp = arp_list; arp ; arp = arp->next) {
        if (arp->csp_addr == csp_addr) {
            memcpy(mac_addr, arp->mac_addr, CSP_ETH_ALEN);
            return;
        }
    }
    // Defaults to returning the broadcast address
    memset(mac_addr, 0xff, CSP_ETH_ALEN);
}